

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

decimal * simdjson::internal::parse_decimal(decimal *__return_storage_ptr__,char **p)

{
  char cVar1;
  byte bVar2;
  uint32_t uVar3;
  byte *pbVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  byte bVar10;
  
  __return_storage_ptr__->num_digits = 0;
  __return_storage_ptr__->decimal_point = 0;
  __return_storage_ptr__->truncated = false;
  pcVar5 = *p;
  cVar1 = *pcVar5;
  __return_storage_ptr__->negative = cVar1 == '-';
  if ((cVar1 == '-') || (cVar1 == '+')) {
    *p = pcVar5 + 1;
  }
  pcVar5 = *p;
  cVar1 = *pcVar5;
  while (cVar1 == '0') {
    pcVar5 = pcVar5 + 1;
    *p = pcVar5;
    cVar1 = *pcVar5;
  }
  pcVar5 = *p;
  uVar6 = __return_storage_ptr__->num_digits;
  cVar1 = *pcVar5;
  while ((byte)(cVar1 - 0x30U) < 10) {
    pcVar5 = pcVar5 + 1;
    if (uVar6 < 0x300) {
      __return_storage_ptr__->digits[uVar6] = cVar1 - 0x30U;
    }
    uVar6 = uVar6 + 1;
    *p = pcVar5;
    cVar1 = *pcVar5;
  }
  __return_storage_ptr__->num_digits = uVar6;
  if (cVar1 == '.') {
    *p = pcVar5 + 1;
    if (__return_storage_ptr__->num_digits == 0) {
      pcVar9 = *p;
      cVar1 = *pcVar9;
      while (cVar1 == '0') {
        pcVar9 = pcVar9 + 1;
        *p = pcVar9;
        cVar1 = *pcVar9;
      }
    }
    pcVar9 = *p;
    uVar6 = __return_storage_ptr__->num_digits;
    cVar1 = *pcVar9;
    while ((byte)(cVar1 - 0x30U) < 10) {
      pcVar9 = pcVar9 + 1;
      if (uVar6 < 0x300) {
        __return_storage_ptr__->digits[uVar6] = cVar1 - 0x30U;
      }
      uVar6 = uVar6 + 1;
      *p = pcVar9;
      cVar1 = *pcVar9;
    }
    __return_storage_ptr__->num_digits = uVar6;
    __return_storage_ptr__->decimal_point = (int)(pcVar5 + 1) - (int)pcVar9;
  }
  uVar3 = __return_storage_ptr__->num_digits;
  if (uVar3 != 0) {
    pcVar5 = *p;
    iVar7 = 0;
    while( true ) {
      pcVar5 = pcVar5 + -1;
      cVar1 = *pcVar5;
      if ((cVar1 != '0') && (cVar1 != '.')) break;
      iVar7 = iVar7 + (uint)(cVar1 == '0');
    }
    __return_storage_ptr__->decimal_point = __return_storage_ptr__->decimal_point + uVar3;
    __return_storage_ptr__->num_digits = uVar3 - iVar7;
  }
  if (0x300 < __return_storage_ptr__->num_digits) {
    __return_storage_ptr__->num_digits = 0x300;
    __return_storage_ptr__->truncated = true;
  }
  pbVar4 = (byte *)*p;
  if ((*pbVar4 | 0x20) == 0x65) {
    *p = (char *)(pbVar4 + 1);
    bVar2 = pbVar4[1];
    if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
      *p = (char *)(pbVar4 + 2);
    }
    pcVar5 = *p;
    bVar10 = *pcVar5 - 0x30;
    iVar7 = 0;
    if (bVar10 < 10) {
      iVar7 = 0;
      do {
        pcVar5 = pcVar5 + 1;
        iVar8 = (uint)bVar10 + iVar7 * 10;
        if (0xffff < iVar7) {
          iVar8 = iVar7;
        }
        iVar7 = iVar8;
        *p = pcVar5;
        bVar10 = *pcVar5 - 0x30;
      } while (bVar10 < 10);
    }
    iVar8 = -iVar7;
    if (bVar2 != 0x2d) {
      iVar8 = iVar7;
    }
    __return_storage_ptr__->decimal_point = __return_storage_ptr__->decimal_point + iVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

decimal parse_decimal(const char *&p) noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if ((*p == '-') || (*p == '+')) {
    ++p;
  }

  while (*p == '0') {
    ++p;
  }
  while (is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if (*p == '.') {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if (answer.num_digits == 0) {
      // skip zeros
      while (*p == '0') {
        ++p;
      }
    }
    while (is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  if(answer.num_digits > 0) {
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == '.')) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits ) {
    answer.num_digits = max_digits;
    answer.truncated = true;
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool neg_exp = false;
    if ('-' == *p) {
      neg_exp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while (is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  return answer;
}